

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O2

double __thiscall
chrono::ChOptimizerGenetic::ComputeFitness(ChOptimizerGenetic *this,ChGenotype *mygen)

{
  uint uVar1;
  double *x;
  Scalar *pSVar2;
  ulong index;
  double dVar3;
  
  uVar1 = (*(this->super_ChOptimizer)._vptr_ChOptimizer[7])();
  x = (double *)calloc((long)(int)uVar1,8);
  for (index = 0; (~((int)uVar1 >> 0x1f) & uVar1) != index; index = index + 1) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)mygen,index);
    x[index] = *pSVar2;
  }
  dVar3 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,x);
  mygen->fitness = dVar3;
  mygen->need_eval = false;
  free(x);
  return dVar3;
}

Assistant:

double ChOptimizerGenetic::ComputeFitness(ChGenotype* mygen) {
    int nv = GetNumOfVars();
    int mvar;
    double mfitness = 0;
    // create temporary array of variables for function-parameter-passing purposes.
    double* myvars = (double*)calloc(nv, sizeof(double));

    // fill the vector of variables as double* array
    for (mvar = 0; mvar < nv; mvar++) {
        myvars[mvar] = mygen->genes(mvar);
    }

    // impose these variables to the system,
    //  Vars_to_System(myvars);
    // evaluate functional,
    mfitness = Eval_fx(myvars);  // ++++++ HERE THE FITNESS IS EVALUATED

    mygen->fitness = mfitness;
    // set flag for speed reasons..
    mygen->need_eval = false;

    free(myvars);  // delete the array of variables

    return mfitness;
}